

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tr1_failurecount_assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_FailureCountTest_x_iutest_x_Fail_Test::Body(iu_FailureCountTest_x_iutest_x_Fail_Test *this)

{
  TestFlag *pTVar1;
  int *in_R9;
  ScopedSPITestFlag guard;
  ScopedDisableTestFailureBreak statements_failure_count_testflag_guard;
  iuCodeMessage local_2a8;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  AssertionResult statemnets_ar;
  Collector<iutest::detail::NoTestPartResultReporter> local_1c8;
  Fixed local_198;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  iutest::detail::StatementsFailureCount::StatementsFailureCount
            ((StatementsFailureCount *)&local_1c8);
  iutest::detail::ScopedDisableTestFailureBreak::ScopedDisableTestFailureBreak
            (&statements_failure_count_testflag_guard);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x2a;
  local_2a8.m_message._M_dataplus._M_p._0_4_ = 1;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"f()","1",(char *)&local_198,(int *)&local_2a8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/tr1_failurecount_assertion_tests.cpp"
               ,0x26,iutest_ar.m_message._M_dataplus._M_p);
    local_2a8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2a8,&local_198);
    std::__cxx11::string::~string((string *)&local_2a8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x2a;
  local_2a8.m_message._M_dataplus._M_p._0_4_ = 0;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"f()","0",(char *)&local_198,(int *)&local_2a8,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/tr1_failurecount_assertion_tests.cpp"
               ,0x26,iutest_ar.m_message._M_dataplus._M_p);
    local_2a8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2a8,&local_198);
    std::__cxx11::string::~string((string *)&local_2a8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar1 = iutest::TestFlag::GetInstance();
  pTVar1->m_test_flags = (int)statements_failure_count_testflag_guard.super_ScopedGuard.m_test_flags
  ;
  iutest::detail::StatementsFailureCount::GetResult
            (&statemnets_ar,(StatementsFailureCount *)&local_1c8,2,
             "IUTEST_EXPECT_EQ(f(), 1); IUTEST_EXPECT_EQ(f(), 0)");
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&local_1c8);
  if (statemnets_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/tr1_failurecount_assertion_tests.cpp"
               ,0x26,statemnets_ar.m_message._M_dataplus._M_p);
    local_2a8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2a8,&local_198);
    std::__cxx11::string::~string((string *)&local_2a8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&statemnets_ar);
  pTVar1 = iutest::TestFlag::GetInstance();
  pTVar1->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"failure count less than 2",(allocator<char> *)&local_2a8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/tr1_failurecount_assertion_tests.cpp"
               ,0x27,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(FailureCountTest, Fail)
{
    IUTEST_EXPECT_FATAL_FAILURE(
        IUTEST_ASSERT_FAILURECOUNT_LT(IUTEST_EXPECT_EQ(f(), 1); IUTEST_EXPECT_EQ(f(), 0), 2)
        , "failure count less than 2");
}